

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O0

Vec_Int_t * Mio_ParseFormula(char *pFormInit,char **ppVarNames,int nVars)

{
  char *__s2;
  int iVar1;
  int iVar2;
  size_t sVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  bool bVar6;
  int local_88;
  uint local_84;
  int v;
  int i;
  int Oper2;
  int Oper1;
  int Oper;
  int Flag;
  int fFound;
  int nParans;
  char *pName;
  char *pTemp;
  Vec_Int_t *gFunc;
  Vec_Int_t *pStackOp;
  Vec_Ptr_t *pStackFn;
  int *pMan;
  char *pcStack_30;
  int Man;
  char *pFormula;
  char **ppcStack_20;
  int nVars_local;
  char **ppVarNames_local;
  char *pFormInit_local;
  
  pStackFn = (Vec_Ptr_t *)((long)&pMan + 4);
  Flag = 0;
  for (pName = pFormInit; *pName != '\0'; pName = pName + 1) {
    if (*pName == '(') {
      Flag = Flag + 1;
    }
    else if (*pName == ')') {
      Flag = Flag + -1;
    }
  }
  pMan._4_4_ = nVars;
  pFormula._4_4_ = nVars;
  ppcStack_20 = ppVarNames;
  ppVarNames_local = (char **)pFormInit;
  if (Flag == 0) {
    sVar3 = strlen(pFormInit);
    pcStack_30 = (char *)malloc(sVar3 + 3);
    sprintf(pcStack_30,"(%s)",ppVarNames_local);
    pStackOp = (Vec_Int_t *)Vec_PtrAlloc(100);
    gFunc = Vec_IntAlloc(100);
    Oper1 = 1;
    for (pName = pcStack_30; pVVar5 = pStackOp, *pName != '\0'; pName = pName + 1) {
      switch(*pName) {
      case '\t':
      case '\n':
      case '\r':
      case ' ':
        goto LAB_00b5fb7b;
      default:
        local_84 = 0;
        while( true ) {
          bVar6 = false;
          if ((((((pName[(int)local_84] != '\0') && (bVar6 = false, pName[(int)local_84] != ' ')) &&
                (bVar6 = false, pName[(int)local_84] != '\t')) &&
               ((bVar6 = false, pName[(int)local_84] != '\r' &&
                (bVar6 = false, pName[(int)local_84] != '\n')))) &&
              ((bVar6 = false, pName[(int)local_84] != '*' &&
               ((bVar6 = false, pName[(int)local_84] != '&' &&
                (bVar6 = false, pName[(int)local_84] != '+')))))) &&
             ((bVar6 = false, pName[(int)local_84] != '|' &&
              ((bVar6 = false, pName[(int)local_84] != '^' &&
               (bVar6 = false, pName[(int)local_84] != '\'')))))) {
            bVar6 = pName[(int)local_84] != ')';
          }
          if (!bVar6) goto LAB_00b5f93a;
          if ((pName[(int)local_84] == '!') || (pName[(int)local_84] == '(')) break;
          local_84 = local_84 + 1;
        }
        fprintf(_stdout,
                "Mio_ParseFormula(): The negation sign or an opening parenthesis inside the variable name.\n"
               );
        Oper1 = 4;
LAB_00b5f93a:
        bVar6 = false;
        for (local_88 = 0; local_88 < pFormula._4_4_; local_88 = local_88 + 1) {
          __s2 = ppcStack_20[local_88];
          iVar1 = strncmp(pName,__s2,(long)(int)local_84);
          if ((iVar1 == 0) && (sVar3 = strlen(__s2), sVar3 == local_84)) {
            pName = pName + (int)(local_84 - 1);
            bVar6 = true;
            break;
          }
        }
        if (bVar6) {
          if (Oper1 == 2) {
            Vec_IntPush(gFunc,9);
          }
          pVVar5 = pStackOp;
          pVVar4 = Exp_Var(local_88);
          Vec_PtrPush((Vec_Ptr_t *)pVVar5,pVVar4);
          Oper1 = 2;
        }
        else {
          fprintf(_stdout,
                  "Mio_ParseFormula(): The parser cannot find var \"%s\" in the input var list.\n",
                  pName);
          Oper1 = 4;
        }
        break;
      case '!':
        if (Oper1 == 2) {
          Vec_IntPush(gFunc,9);
          Oper1 = 3;
        }
        Vec_IntPush(gFunc,10);
        break;
      case '&':
      case '*':
      case '+':
      case '^':
      case '|':
        if (Oper1 == 2) {
          if ((*pName == '*') || (*pName == '&')) {
            Vec_IntPush(gFunc,9);
          }
          else if ((*pName == '+') || (*pName == '|')) {
            Vec_IntPush(gFunc,7);
          }
          else {
            Vec_IntPush(gFunc,8);
          }
          Oper1 = 3;
        }
        else {
          fprintf(_stdout,"Mio_ParseFormula(): There is no variable before AND, EXOR, or OR.\n");
          Oper1 = 4;
        }
        break;
      case '\'':
        if (Oper1 == 2) {
          pVVar4 = (Vec_Int_t *)Vec_PtrPop((Vec_Ptr_t *)pStackOp);
          pVVar4 = Exp_Not(pVVar4);
          Vec_PtrPush((Vec_Ptr_t *)pVVar5,pVVar4);
        }
        else {
          fprintf(_stdout,
                  "Mio_ParseFormula(): No variable is specified before the negation suffix.\n");
          Oper1 = 4;
        }
        break;
      case '(':
        if (Oper1 == 2) {
          Vec_IntPush(gFunc,9);
        }
        Vec_IntPush(gFunc,1);
        Oper1 = 1;
        break;
      case ')':
        iVar1 = Vec_IntSize(gFunc);
        if (iVar1 == 0) {
          fprintf(_stdout,"Mio_ParseFormula(): There is no opening parenthesis\n");
          Oper1 = 4;
        }
        else {
          while (iVar1 = Vec_IntSize(gFunc), iVar1 != 0) {
            iVar1 = Vec_IntPop(gFunc);
            if (iVar1 == 1) goto LAB_00b5f759;
            pVVar5 = Mio_ParseFormulaOper
                               (&pStackFn->nCap,pFormula._4_4_,(Vec_Ptr_t *)pStackOp,iVar1);
            if (pVVar5 == (Vec_Int_t *)0x0) {
              fprintf(_stdout,"Mio_ParseFormula(): Unknown operation\n");
              if (pcStack_30 != (char *)0x0) {
                free(pcStack_30);
                pcStack_30 = (char *)0x0;
              }
              Vec_PtrFreeP((Vec_Ptr_t **)&pStackOp);
              Vec_IntFreeP(&gFunc);
              return (Vec_Int_t *)0x0;
            }
          }
          fprintf(_stdout,"Mio_ParseFormula(): There is no opening parenthesis\n");
          Oper1 = 4;
LAB_00b5f759:
          if (Oper1 != 4) {
            Oper1 = 2;
          }
        }
        break;
      case '0':
        pVVar4 = Exp_Const0();
        Vec_PtrPush((Vec_Ptr_t *)pVVar5,pVVar4);
        if (Oper1 == 2) {
          fprintf(_stdout,"Mio_ParseFormula(): No operation symbol before constant 0.\n");
          Oper1 = 4;
        }
        else {
          Oper1 = 2;
        }
        break;
      case '1':
        pVVar4 = Exp_Const1();
        Vec_PtrPush((Vec_Ptr_t *)pVVar5,pVVar4);
        if (Oper1 == 2) {
          fprintf(_stdout,"Mio_ParseFormula(): No operation symbol before constant 1.\n");
          Oper1 = 4;
        }
        else {
          Oper1 = 2;
        }
      }
      if (Oper1 == 4) break;
      if (Oper1 != 1) {
        if (Oper1 == 2) {
          while (iVar1 = Vec_IntSize(gFunc), iVar1 != 0) {
            iVar1 = Vec_IntPop(gFunc);
            pVVar5 = pStackOp;
            if (iVar1 != 10) {
              Vec_IntPush(gFunc,iVar1);
              break;
            }
            pVVar4 = (Vec_Int_t *)Vec_PtrPop((Vec_Ptr_t *)pStackOp);
            pVVar4 = Exp_Not(pVVar4);
            Vec_PtrPush((Vec_Ptr_t *)pVVar5,pVVar4);
          }
        }
        else {
          while( true ) {
            iVar1 = Vec_IntPop(gFunc);
            iVar2 = Vec_IntSize(gFunc);
            if (iVar2 == 0) break;
            iVar2 = Vec_IntPop(gFunc);
            if (iVar2 < iVar1) {
              Vec_IntPush(gFunc,iVar2);
              Vec_IntPush(gFunc,iVar1);
              goto LAB_00b5fb7b;
            }
            pVVar5 = Mio_ParseFormulaOper
                               (&pStackFn->nCap,pFormula._4_4_,(Vec_Ptr_t *)pStackOp,iVar2);
            if (pVVar5 == (Vec_Int_t *)0x0) {
              fprintf(_stdout,"Mio_ParseFormula(): Unknown operation\n");
              if (pcStack_30 != (char *)0x0) {
                free(pcStack_30);
                pcStack_30 = (char *)0x0;
              }
              Vec_PtrFreeP((Vec_Ptr_t **)&pStackOp);
              Vec_IntFreeP(&gFunc);
              return (Vec_Int_t *)0x0;
            }
            Vec_IntPush(gFunc,iVar1);
          }
          Vec_IntPush(gFunc,iVar1);
        }
      }
LAB_00b5fb7b:
    }
    if (Oper1 != 4) {
      iVar1 = Vec_PtrSize((Vec_Ptr_t *)pStackOp);
      if (iVar1 == 0) {
        fprintf(_stdout,"Mio_ParseFormula(): The input string is empty\n");
      }
      else {
        pVVar5 = (Vec_Int_t *)Vec_PtrPop((Vec_Ptr_t *)pStackOp);
        iVar1 = Vec_PtrSize((Vec_Ptr_t *)pStackOp);
        if (iVar1 == 0) {
          iVar1 = Vec_IntSize(gFunc);
          if (iVar1 == 0) {
            if (pcStack_30 != (char *)0x0) {
              free(pcStack_30);
              pcStack_30 = (char *)0x0;
            }
            Vec_PtrFreeP((Vec_Ptr_t **)&pStackOp);
            Vec_IntFreeP(&gFunc);
            pVVar5 = Exp_Reverse(pVVar5);
            return pVVar5;
          }
          fprintf(_stdout,"Mio_ParseFormula(): Something is left in the operation stack\n");
        }
        else {
          fprintf(_stdout,"Mio_ParseFormula(): Something is left in the function stack\n");
        }
      }
    }
    if (pcStack_30 != (char *)0x0) {
      free(pcStack_30);
      pcStack_30 = (char *)0x0;
    }
    Vec_PtrFreeP((Vec_Ptr_t **)&pStackOp);
    Vec_IntFreeP(&gFunc);
  }
  else {
    fprintf(_stdout,"Mio_ParseFormula(): Different number of opening and closing parentheses ().\n")
    ;
  }
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Mio_ParseFormula( char * pFormInit, char ** ppVarNames, int nVars )
{
    char * pFormula;
    int Man = nVars, * pMan = &Man;
    Vec_Ptr_t * pStackFn;
    Vec_Int_t * pStackOp;
    Vec_Int_t * gFunc;
    char * pTemp, * pName;
    int nParans, fFound, Flag;
    int Oper, Oper1, Oper2;
    int i, v;

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormInit; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        fprintf( stdout, "Mio_ParseFormula(): Different number of opening and closing parentheses ().\n" );
        return NULL;
    }

    // copy the formula
    pFormula = ABC_ALLOC( char, strlen(pFormInit) + 3 );
    sprintf( pFormula, "(%s)", pFormInit );

    // start the stacks
    pStackFn = Vec_PtrAlloc( 100 );
    pStackOp = Vec_IntAlloc( 100 );

    Flag = MIO_EQN_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
    {
        switch ( *pTemp )
        {
        // skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
            continue;
        case MIO_EQN_SYM_CONST0:
            Vec_PtrPush( pStackFn, Exp_Const0() );  // Cudd_Ref( b0 );
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): No operation symbol before constant 0.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        case MIO_EQN_SYM_CONST1:
            Vec_PtrPush( pStackFn, Exp_Const1() );  //  Cudd_Ref( b1 );
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): No operation symbol before constant 1.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        case MIO_EQN_SYM_NEG:
            if ( Flag == MIO_EQN_FLAG_VAR )
            {// if NEGBEF follows a variable, AND is assumed
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
                Flag = MIO_EQN_FLAG_OPER;
            }
            Vec_IntPush( pStackOp, MIO_EQN_OPER_NEG );
            break;
        case MIO_EQN_SYM_NEGAFT:
            if ( Flag != MIO_EQN_FLAG_VAR )
            {// if there is no variable before NEGAFT, it is an error
                fprintf( stdout, "Mio_ParseFormula(): No variable is specified before the negation suffix.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            else // if ( Flag == PARSE_FLAG_VAR )
                Vec_PtrPush( pStackFn, Exp_Not( (Vec_Int_t *)Vec_PtrPop(pStackFn) ) );
            break;
        case MIO_EQN_SYM_AND:
        case MIO_EQN_SYM_AND2:
        case MIO_EQN_SYM_OR:
        case MIO_EQN_SYM_OR2:
        case MIO_EQN_SYM_XOR:
            if ( Flag != MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): There is no variable before AND, EXOR, or OR.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            if ( *pTemp == MIO_EQN_SYM_AND || *pTemp == MIO_EQN_SYM_AND2 )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
            else if ( *pTemp == MIO_EQN_SYM_OR || *pTemp == MIO_EQN_SYM_OR2 )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_OR );
            else //if ( *pTemp == MIO_EQN_SYM_XOR )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_XOR );
            Flag = MIO_EQN_FLAG_OPER; 
            break;
        case MIO_EQN_SYM_OPEN:
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
//                fprintf( stdout, "Mio_ParseFormula(): An opening parenthesis follows a var without operation sign.\n" ); 
//                Flag = MIO_EQN_FLAG_ERROR; 
//              break; 
            }
            Vec_IntPush( pStackOp, MIO_EQN_OPER_MARK );
            // after an opening bracket, it feels like starting over again
            Flag = MIO_EQN_FLAG_START; 
            break;
        case MIO_EQN_SYM_CLOSE:
            if ( Vec_IntSize( pStackOp ) != 0 )
            {
                while ( 1 )
                {
                    if ( Vec_IntSize( pStackOp ) == 0 )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): There is no opening parenthesis\n" );
                        Flag = MIO_EQN_FLAG_ERROR; 
                        break;
                    }
                    Oper = Vec_IntPop( pStackOp );
                    if ( Oper == MIO_EQN_OPER_MARK )
                        break;

                    // perform the given operation
                    if ( Mio_ParseFormulaOper( pMan, nVars, pStackFn, Oper ) == NULL )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Vec_PtrFreeP( &pStackFn );
                        Vec_IntFreeP( &pStackOp );
                        return NULL;
                    }
                }
            }
            else
            {
                fprintf( stdout, "Mio_ParseFormula(): There is no opening parenthesis\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            if ( Flag != MIO_EQN_FLAG_ERROR )
                Flag = MIO_EQN_FLAG_VAR; 
            break;


        default:
            // scan the next name
            for ( i = 0; pTemp[i] && 
                         pTemp[i] != ' ' && pTemp[i] != '\t' && pTemp[i] != '\r' && pTemp[i] != '\n' &&
                         pTemp[i] != MIO_EQN_SYM_AND && pTemp[i] != MIO_EQN_SYM_AND2 && pTemp[i] != MIO_EQN_SYM_OR && pTemp[i] != MIO_EQN_SYM_OR2 && 
                         pTemp[i] != MIO_EQN_SYM_XOR && pTemp[i] != MIO_EQN_SYM_NEGAFT && pTemp[i] != MIO_EQN_SYM_CLOSE; 
                  i++ )
              {
                    if ( pTemp[i] == MIO_EQN_SYM_NEG || pTemp[i] == MIO_EQN_SYM_OPEN )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): The negation sign or an opening parenthesis inside the variable name.\n" );
                        Flag = MIO_EQN_FLAG_ERROR; 
                        break;
                    }
              }
            // variable name is found
            fFound = 0;
//            Vec_PtrForEachEntry( char *, vVarNames, pName, v )
            for ( v = 0; v < nVars; v++ )
            {
                pName = ppVarNames[v];
                if ( strncmp(pTemp, pName, i) == 0 && strlen(pName) == (unsigned)i )
                {
                    pTemp += i-1;
                    fFound = 1;
                    break;
                }
            }
            if ( !fFound )
            { 
                fprintf( stdout, "Mio_ParseFormula(): The parser cannot find var \"%s\" in the input var list.\n", pTemp ); 
                Flag = MIO_EQN_FLAG_ERROR; 
                break; 
            }
/*
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): The variable name \"%s\" follows another var without operation sign.\n", pTemp ); 
                Flag = MIO_EQN_FLAG_ERROR; 
                break; 
            }
*/
            if ( Flag == MIO_EQN_FLAG_VAR )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );

            Vec_PtrPush( pStackFn, Exp_Var(v) ); // Cudd_Ref( pbVars[v] );
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        }

        if ( Flag == MIO_EQN_FLAG_ERROR )
            break;      // error exit
        else if ( Flag == MIO_EQN_FLAG_START )
            continue;  //  go on parsing
        else if ( Flag == MIO_EQN_FLAG_VAR )
            while ( 1 )
            {  // check if there are negations in the OpStack     
                if ( Vec_IntSize( pStackOp ) == 0 )
                    break;
                Oper = Vec_IntPop( pStackOp );
                if ( Oper != MIO_EQN_OPER_NEG )
                {
                    Vec_IntPush( pStackOp, Oper );
                    break;
                }
                else
                {
                      Vec_PtrPush( pStackFn, Exp_Not((Vec_Int_t *)Vec_PtrPop(pStackFn)) );
                }
            }
        else // if ( Flag == MIO_EQN_FLAG_OPER )
            while ( 1 )
            {  // execute all the operations in the OpStack
               // with precedence higher or equal than the last one
                Oper1 = Vec_IntPop( pStackOp ); // the last operation
                if ( Vec_IntSize( pStackOp ) == 0 ) 
                {  // if it is the only operation, push it back
                    Vec_IntPush( pStackOp, Oper1 );
                    break;
                }
                Oper2 = Vec_IntPop( pStackOp ); // the operation before the last one
                if ( Oper2 >= Oper1 )  
                {  // if Oper2 precedence is higher or equal, execute it
                    if ( Mio_ParseFormulaOper( pMan, nVars, pStackFn, Oper2 ) == NULL )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Vec_PtrFreeP( &pStackFn );
                        Vec_IntFreeP( &pStackOp );
                        return NULL;
                    }
                    Vec_IntPush( pStackOp,  Oper1 );     // push the last operation back
                }
                else
                {  // if Oper2 precedence is lower, push them back and done
                    Vec_IntPush( pStackOp, Oper2 );
                    Vec_IntPush( pStackOp, Oper1 );
                    break;
                }
            }
    }

    if ( Flag != MIO_EQN_FLAG_ERROR )
    {
        if ( Vec_PtrSize(pStackFn) != 0 )
        {    
            gFunc = (Vec_Int_t *)Vec_PtrPop(pStackFn);
            if ( Vec_PtrSize(pStackFn) == 0 )
                if ( Vec_IntSize( pStackOp ) == 0 )
                {
//                    Cudd_Deref( gFunc );
                    ABC_FREE( pFormula );
                    Vec_PtrFreeP( &pStackFn );
                    Vec_IntFreeP( &pStackOp );
                    return Exp_Reverse(gFunc);
                }
                else
                    fprintf( stdout, "Mio_ParseFormula(): Something is left in the operation stack\n" );
            else
                fprintf( stdout, "Mio_ParseFormula(): Something is left in the function stack\n" );
        }
        else
            fprintf( stdout, "Mio_ParseFormula(): The input string is empty\n" );
    }
    ABC_FREE( pFormula );
    Vec_PtrFreeP( &pStackFn );
    Vec_IntFreeP( &pStackOp );
    return NULL;
}